

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  void *__ptr;
  void *__ptr_00;
  size_t unaff_retaddr;
  uchar *in_stack_00000008;
  char *in_stack_00000010;
  size_t uncomprLen;
  size_t comprLen;
  uchar *uncompr;
  uchar *compr;
  undefined4 in_stack_00000044;
  size_t in_stack_00000048;
  uchar *in_stack_00000050;
  int in_stack_00000074;
  size_t in_stack_00000078;
  uchar *in_stack_00000080;
  size_t in_stack_00000088;
  uchar *in_stack_00000090;
  size_t in_stack_00000098;
  uchar *in_stack_000000a0;
  size_t in_stack_000000a8;
  uchar *in_stack_000000b0;
  size_t in_stack_00008028;
  uchar *in_stack_00008030;
  size_t in_stack_00008038;
  uchar *in_stack_00008040;
  size_t in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  FILE *in_stack_ffffffffffffffc8;
  uchar *compr_00;
  
  compr_00 = (uchar *)0x9c40;
  pcVar2 = (char *)zlibng_version();
  if (*pcVar2 != *main::myVersion) {
    fprintf(_stderr,"incompatible zlib version\n");
    exit(1);
  }
  pcVar2 = (char *)zlibng_version();
  iVar1 = strcmp(pcVar2,"2.2.4");
  if (iVar1 != 0) {
    in_stack_ffffffffffffffc8 = _stderr;
    uVar3 = zlibng_version();
    fprintf(in_stack_ffffffffffffffc8,"warning: different zlib version linked: %s\n",uVar3);
  }
  uVar3 = zng_zlibCompileFlags();
  printf("zlib-ng version %s = 0x%08lx, compile flags = 0x%lx\n","2.2.4",0x20204f0,uVar3);
  __ptr = calloc(40000,1);
  __ptr_00 = calloc((ulong)compr_00 & 0xffffffff,1);
  if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
    error("out of memory\n");
  }
  test_compress(compr_00,(size_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                in_stack_ffffffffffffffb8);
  test_gzio(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  test_deflate((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv);
  test_inflate((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv,compr,(size_t)uncompr);
  test_large_deflate(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                     in_stack_00000074);
  test_large_inflate((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv,compr,(size_t)uncompr);
  test_large_deflate(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                     in_stack_00000074);
  test_large_inflate((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv,compr,(size_t)uncompr);
  test_flush(compr,(size_t *)uncompr);
  test_sync((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv,compr,(size_t)uncompr);
  test_dict_deflate(compr,(size_t)uncompr);
  test_dict_inflate(in_stack_00008040,in_stack_00008038,in_stack_00008030,in_stack_00008028);
  test_deflate_bound();
  test_deflate_copy(in_stack_000000a0,in_stack_00000098);
  test_deflate_get_dict((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv);
  test_deflate_set_header((uchar *)CONCAT44(in_stack_00000044,argc),(size_t)argv);
  test_deflate_tune(in_stack_00000050,in_stack_00000048);
  test_deflate_pending(in_stack_00000050,in_stack_00000048);
  test_deflate_prime(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  free(__ptr);
  free(__ptr_00);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    unsigned char *compr, *uncompr;
    z_uintmax_t comprLen = 10000*sizeof(int); /* don't overflow on MSDOS */
    z_uintmax_t uncomprLen = comprLen;
    static const char* myVersion = PREFIX2(VERSION);

    if (zVersion()[0] != myVersion[0]) {
        fprintf(stderr, "incompatible zlib version\n");
        exit(1);

    } else if (strcmp(zVersion(), PREFIX2(VERSION)) != 0) {
        fprintf(stderr, "warning: different zlib version linked: %s\n", zVersion());
    }

    printf("zlib-ng version %s = 0x%08lx, compile flags = 0x%lx\n",
            ZLIBNG_VERSION, ZLIBNG_VERNUM, PREFIX(zlibCompileFlags)());

    compr    = (unsigned char*)calloc((unsigned int)comprLen, 1);
    uncompr  = (unsigned char*)calloc((unsigned int)uncomprLen, 1);
    /* compr and uncompr are cleared to avoid reading uninitialized
     * data and to ensure that uncompr compresses well.
     */
    if (compr == NULL || uncompr == NULL)
        error("out of memory\n");

    test_compress(compr, comprLen, uncompr, uncomprLen);

    test_gzio((argc > 1 ? argv[1] : TESTFILE),
              uncompr, uncomprLen);

    test_deflate(compr, comprLen);
    test_inflate(compr, comprLen, uncompr, uncomprLen);

    test_large_deflate(compr, comprLen, uncompr, uncomprLen, 0);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);

#ifndef ZLIB_COMPAT
    test_large_deflate(compr, comprLen, uncompr, uncomprLen, 1);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);
#endif

    test_flush(compr, &comprLen);
#ifdef ZLIBNG_ENABLE_TESTS
    test_sync(compr, comprLen, uncompr, uncomprLen);
#endif
    comprLen = uncomprLen;

    test_dict_deflate(compr, comprLen);
    test_dict_inflate(compr, comprLen, uncompr, uncomprLen);

    test_deflate_bound();
    test_deflate_copy(compr, comprLen);
    test_deflate_get_dict(compr, comprLen);
    test_deflate_set_header(compr, comprLen);
    test_deflate_tune(compr, comprLen);
    test_deflate_pending(compr, comprLen);
    test_deflate_prime(compr, comprLen, uncompr, uncomprLen);

    free(compr);
    free(uncompr);

    return 0;
}